

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O1

int __thiscall
capnp::TwoPartyVatNetwork::accept
          (TwoPartyVatNetwork *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined4 in_register_00000034;
  long lVar3;
  Connection *pCVar4;
  Disposer *pDVar5;
  PromiseFulfillerPair<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>_>
  paf;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined8 uStack_40;
  undefined8 *local_38;
  long *local_30;
  Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,_capnp::rpc::twoparty::ProvisionId,_capnp::rpc::twoparty::RecipientId,_capnp::rpc::twoparty::ThirdPartyCapId,_capnp::rpc::twoparty::JoinResult>::Connection>
  local_28;
  
  lVar3 = CONCAT44(in_register_00000034,__fd);
  if ((*(short *)(lVar3 + 0x18) == 0) && (*(char *)(lVar3 + 0x120) == '\0')) {
    *(undefined1 *)(lVar3 + 0x120) = 1;
    local_28.disposer = (Disposer *)(lVar3 + 0x160);
    *(int *)(lVar3 + 0x178) = *(int *)(lVar3 + 0x178) + 1;
    local_28.ptr = (Connection *)(lVar3 + 8);
    kj::
    heap<kj::_::ImmediatePromiseNode<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>,kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>
              ((kj *)&local_48,&local_28);
    pCVar4 = local_28.ptr;
    *(undefined4 *)&(this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
         local_48;
    *(undefined4 *)
     ((long)&(this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase + 4) =
         uStack_44;
    *(undefined4 *)&(this->super_Connection).super_Connection._vptr_Connection =
         (undefined4)uStack_40;
    *(undefined4 *)((long)&(this->super_Connection).super_Connection._vptr_Connection + 4) =
         uStack_40._4_4_;
    if (local_28.ptr == (Connection *)0x0) goto LAB_003dddb8;
    local_28.ptr = (Connection *)0x0;
    pDVar5 = local_28.disposer;
  }
  else {
    kj::
    newPromiseAndFulfiller<kj::Own<capnp::VatNetwork<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>::Connection>>
              ();
    puVar1 = *(undefined8 **)(lVar3 + 0x140);
    plVar2 = *(long **)(lVar3 + 0x148);
    *(undefined8 **)(lVar3 + 0x140) = local_38;
    *(long **)(lVar3 + 0x148) = local_30;
    local_30 = (long *)0x0;
    if (plVar2 != (long *)0x0) {
      (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    plVar2 = local_30;
    (this->super_TwoPartyVatNetworkBase).super_VatNetworkBase._vptr_VatNetworkBase =
         (_func_int **)CONCAT44(uStack_44,local_48);
    (this->super_Connection).super_Connection._vptr_Connection = (_func_int **)uStack_40;
    uStack_40 = (Connection *)0x0;
    if (local_30 != (long *)0x0) {
      local_30 = (long *)0x0;
      (**(code **)*local_38)(local_38,(long)plVar2 + *(long *)(*plVar2 + -0x10));
    }
    if (uStack_40 == (Connection *)0x0) goto LAB_003dddb8;
    pCVar4 = uStack_40;
    pDVar5 = (Disposer *)CONCAT44(uStack_44,local_48);
  }
  uStack_40 = (Connection *)0x0;
  (**pDVar5->_vptr_Disposer)
            (pDVar5,(pCVar4->super_Connection)._vptr_Connection[-2] +
                    (long)&(pCVar4->super_Connection)._vptr_Connection);
LAB_003dddb8:
  return (int)this;
}

Assistant:

kj::Promise<kj::Own<TwoPartyVatNetworkBase::Connection>> TwoPartyVatNetwork::accept() {
  if (side == rpc::twoparty::Side::SERVER && !accepted) {
    accepted = true;
    return asConnection();
  } else {
    // Create a promise that will never be fulfilled.
    auto paf = kj::newPromiseAndFulfiller<kj::Own<TwoPartyVatNetworkBase::Connection>>();
    acceptFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}